

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNFOnTheFly.cpp
# Opt level: O1

ClauseIterator __thiscall
Inferences::produceClauses
          (Inferences *this,Clause *c,bool generating,SkolemisingFormulaIndex *index)

{
  code *pcVar1;
  Literal *lit;
  TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_> *pTVar2;
  Term *term;
  TermList *pTVar3;
  uint64_t uVar4;
  ulong *puVar5;
  IteratorCore<Kernel::Clause_*> *pIVar6;
  byte bVar7;
  bool bVar8;
  char cVar9;
  Proxy PVar10;
  uint uVar11;
  void **head_1;
  TermList arg2;
  TermList arg2_00;
  TermList sort;
  ulong uVar12;
  Literal *pLVar13;
  Literal *d;
  Literal *d_00;
  Clause *pCVar14;
  TermList TVar15;
  TermList TVar16;
  TermList TVar17;
  TermList TVar18;
  long *plVar19;
  TermList sort_00;
  Literal *pLVar20;
  Clause *pCVar21;
  ItemList *pIVar22;
  _func_int **pp_Var23;
  ulong uVar24;
  undefined7 in_register_00000011;
  InferenceRule r;
  TermList head;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
  results;
  TermList resultSort;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>
  tqr;
  Literal *e;
  Clause **local_138;
  _func_int *local_f8;
  TermList local_f0;
  Iterator local_e8;
  undefined4 local_cc;
  IteratorCore<Kernel::Clause_*> *local_c8;
  TermList local_c0;
  undefined1 local_b8 [16];
  TermList *local_a8;
  TermList **local_98;
  Term **local_78;
  uint *local_58;
  bool local_48;
  ulong local_40;
  ulong local_38;
  
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::eager == '\0') {
    produceClauses();
  }
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::simp == '\0') {
    produceClauses();
  }
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::gen == '\0') {
    produceClauses();
  }
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
      simp_except_not_be_off == '\0') {
    produceClauses();
  }
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
      simp_except_not_and_be == '\0') {
    produceClauses();
  }
  if (produceClauses::simp_except_not_be_off == false) {
    bVar7 = produceClauses::simp_except_not_and_be ^ 1U | generating;
  }
  else {
    bVar7 = 0;
  }
  if (generating) {
    if ((produceClauses::eager != false) || (produceClauses::simp == true)) goto LAB_004bf0e2;
    if (generating) goto LAB_004bf0ff;
  }
  if (produceClauses::gen != true) {
LAB_004bf0ff:
    arg2._content = (uint64_t)Kernel::Term::foolTrue();
    arg2_00._content = (uint64_t)Kernel::Term::foolFalse();
    sort = Kernel::AtomicSort::boolSort();
    if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::args == '\0') {
      produceClauses();
    }
    local_f0._content = 2;
    local_138 = (Clause **)0x0;
    e = (Literal *)0x0;
    local_c8 = (IteratorCore<Kernel::Clause_*> *)this;
    if ((*(ulong *)&c->field_0x38 & 0xfffff) != 0) {
      local_cc = (undefined4)CONCAT71(in_register_00000011,generating);
      local_40 = (ulong)((uint)*(ulong *)&c->field_0x38 & 0xfffff);
      uVar24 = 0;
      do {
        lit = c->_literals[uVar24];
        uVar12 = (ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
        TVar15._content = (lit->super_Term)._args[uVar12 - 1]._content;
        TVar16._content = (lit->super_Term)._args[uVar12]._content;
        local_38 = uVar24;
        bVar8 = ApplicativeHelper::isBool(TVar16);
        TVar18._content = TVar15._content;
        TVar17._content = TVar16._content;
        if ((!bVar8) &&
           (bVar8 = ApplicativeHelper::isBool(TVar15), TVar18._content = TVar16._content,
           TVar17._content = TVar15._content, !bVar8)) {
          TVar18 = Kernel::SortHelper::getEqualityArgumentSort(lit);
          uVar11 = 4;
          if ((TVar18._content == sort._content & bVar7) != 1) goto LAB_004bff9d;
          pLVar20 = Kernel::Literal::createEquality(true,TVar16,arg2,sort);
          pLVar13 = Kernel::Literal::createEquality(true,TVar16,arg2_00,sort);
          d = Kernel::Literal::createEquality(true,TVar15,arg2,sort);
          d_00 = Kernel::Literal::createEquality(true,TVar15,arg2_00,sort);
          if (((lit->super_Term)._args[0]._content & 4) == 0) {
            pCVar14 = replaceLits(c,lit,pLVar20,BINARY_CONN_ELIMINATION,true,d,e);
            pCVar21 = replaceLits(c,lit,pLVar13,BINARY_CONN_ELIMINATION,true,d_00,e);
            if (local_138 == (Clause **)0x0) {
              ::Lib::Stack<Kernel::Clause_*>::expand
                        ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
            }
            *local_138 = pCVar14;
            local_138 = local_138 + 1;
            if (local_138 == (Clause **)0x0) {
              ::Lib::Stack<Kernel::Clause_*>::expand
                        ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
            }
          }
          else {
            pCVar14 = replaceLits(c,lit,pLVar20,BINARY_CONN_ELIMINATION,true,d_00,e);
            pCVar21 = replaceLits(c,lit,pLVar13,BINARY_CONN_ELIMINATION,true,d,e);
            if (local_138 == (Clause **)0x0) {
              ::Lib::Stack<Kernel::Clause_*>::expand
                        ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
            }
            *local_138 = pCVar14;
            local_138 = local_138 + 1;
            if (local_138 == (Clause **)0x0) {
              ::Lib::Stack<Kernel::Clause_*>::expand
                        ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
            }
          }
          goto LAB_004bff8a;
        }
        ApplicativeHelper::getHeadAndArgs(TVar18,&local_f0,&produceClauses::args);
        PVar10 = ApplicativeHelper::getProxy(local_f0);
        uVar11 = 4;
        if (((PVar10 < (PI|EXISTS)) && ((0x860U >> (PVar10 & 0x1f) & 1) != 0)) ||
           (((char)local_cc != '\0' && ((PVar10 != NOT && (produceClauses::gen == false))))))
        goto LAB_004bff9d;
        bVar8 = ApplicativeHelper::isTrue(TVar17);
        bVar8 = bVar8 != (((lit->super_Term)._args[0]._content & 4) == 0);
        switch(PVar10) {
        case AND:
switchD_004bf246_caseD_0:
          if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
            if (bVar8) {
              pLVar20 = Kernel::Literal::createEquality
                                  (true,(TermList)(produceClauses::args._stack)->_content,arg2,sort)
              ;
              pLVar13 = Kernel::Literal::createEquality
                                  (true,(TermList)produceClauses::args._stack[1]._content,arg2,sort)
              ;
              pCVar14 = replaceLits(c,lit,pLVar20,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
              pCVar21 = replaceLits(c,lit,pLVar13,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
              if (local_138 == (Clause **)0x0) {
                ::Lib::Stack<Kernel::Clause_*>::expand
                          ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
              }
              *local_138 = pCVar14;
              local_138 = local_138 + 1;
              if (local_138 == (Clause **)0x0) {
                ::Lib::Stack<Kernel::Clause_*>::expand
                          ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
              }
            }
            else {
              pLVar20 = Kernel::Literal::createEquality
                                  (true,(TermList)(produceClauses::args._stack)->_content,arg2_00,
                                   sort);
              pLVar13 = Kernel::Literal::createEquality
                                  (true,(TermList)produceClauses::args._stack[1]._content,arg2_00,
                                   sort);
              pCVar21 = replaceLits(c,lit,pLVar20,BINARY_CONN_ELIMINATION,false,pLVar13,e);
              if (local_138 == (Clause **)0x0) {
                ::Lib::Stack<Kernel::Clause_*>::expand
                          ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
              }
            }
            goto LAB_004bff8a;
          }
          if (PVar10 == EQUALS) goto switchD_004bf246_caseD_a;
          if (PVar10 != NOT) goto LAB_004bf58a;
        case NOT:
switchD_004bf246_caseD_7:
          if (produceClauses::args._cursor == produceClauses::args._stack) break;
          TVar15._content = arg2._content;
          if (bVar8) {
            TVar15._content = arg2_00._content;
          }
          pLVar20 = Kernel::Literal::createEquality
                              (true,(TermList)(produceClauses::args._stack)->_content,TVar15,sort);
          pCVar21 = replaceLits(c,lit,pLVar20,HOL_NOT_ELIMINATION,false,(Literal *)0x0,e);
          if (local_138 == (Clause **)0x0) {
            ::Lib::Stack<Kernel::Clause_*>::expand
                      ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
          }
          goto LAB_004bff8a;
        case OR:
          if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
            if (bVar8) {
              pLVar20 = Kernel::Literal::createEquality
                                  (true,(TermList)(produceClauses::args._stack)->_content,arg2,sort)
              ;
              pLVar13 = Kernel::Literal::createEquality
                                  (true,(TermList)produceClauses::args._stack[1]._content,arg2,sort)
              ;
              pCVar21 = replaceLits(c,lit,pLVar20,BINARY_CONN_ELIMINATION,false,pLVar13,e);
              if (local_138 == (Clause **)0x0) {
                ::Lib::Stack<Kernel::Clause_*>::expand
                          ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
              }
            }
            else {
              pLVar20 = Kernel::Literal::createEquality
                                  (true,(TermList)(produceClauses::args._stack)->_content,arg2_00,
                                   sort);
              pLVar13 = Kernel::Literal::createEquality
                                  (true,(TermList)produceClauses::args._stack[1]._content,arg2_00,
                                   sort);
              pCVar14 = replaceLits(c,lit,pLVar20,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
              pCVar21 = replaceLits(c,lit,pLVar13,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
              if (local_138 == (Clause **)0x0) {
                ::Lib::Stack<Kernel::Clause_*>::expand
                          ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
              }
              *local_138 = pCVar14;
              local_138 = local_138 + 1;
              if (local_138 == (Clause **)0x0) {
                ::Lib::Stack<Kernel::Clause_*>::expand
                          ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
              }
            }
            goto LAB_004bff8a;
          }
          if (6 < (int)PVar10) goto LAB_004bf628;
          if (PVar10 == AND) goto switchD_004bf246_caseD_0;
LAB_004bf58a:
          if (PVar10 == IMP) goto switchD_004bf246_caseD_2;
          break;
        case IMP:
switchD_004bf246_caseD_2:
          if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
            if (bVar8) {
              pLVar20 = Kernel::Literal::createEquality
                                  (true,(TermList)produceClauses::args._stack[1]._content,arg2_00,
                                   sort);
              pLVar13 = Kernel::Literal::createEquality
                                  (true,(TermList)(produceClauses::args._stack)->_content,arg2,sort)
              ;
              pCVar21 = replaceLits(c,lit,pLVar20,BINARY_CONN_ELIMINATION,false,pLVar13,e);
              if (local_138 == (Clause **)0x0) {
                ::Lib::Stack<Kernel::Clause_*>::expand
                          ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
              }
            }
            else {
              pLVar20 = Kernel::Literal::createEquality
                                  (true,(TermList)produceClauses::args._stack[1]._content,arg2,sort)
              ;
              pLVar13 = Kernel::Literal::createEquality
                                  (true,(TermList)(produceClauses::args._stack)->_content,arg2_00,
                                   sort);
              pCVar14 = replaceLits(c,lit,pLVar13,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
              pCVar21 = replaceLits(c,lit,pLVar20,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
              if (local_138 == (Clause **)0x0) {
                ::Lib::Stack<Kernel::Clause_*>::expand
                          ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
              }
              *local_138 = pCVar14;
              local_138 = local_138 + 1;
              if (local_138 == (Clause **)0x0) {
                ::Lib::Stack<Kernel::Clause_*>::expand
                          ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
              }
            }
            goto LAB_004bff8a;
          }
LAB_004bf628:
          if (PVar10 == NOT) goto switchD_004bf246_caseD_7;
          if (PVar10 == EQUALS) goto switchD_004bf246_caseD_a;
          break;
        case EQUALS:
switchD_004bf246_caseD_a:
          if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
            TVar15 = Kernel::SortHelper::getResultSort(local_f0._content);
            pLVar20 = Kernel::Literal::createEquality
                                (bVar8,(TermList)(produceClauses::args._stack)->_content,
                                 (TermList)produceClauses::args._stack[1]._content,
                                 (TermList)
                                 *(uint64_t *)
                                  (TVar15._content + 0x28 +
                                  (ulong)(*(uint *)(TVar15._content + 0xc) & 0xfffffff) * 8));
            pCVar21 = replaceLits(c,lit,pLVar20,HOL_EQUALITY_ELIMINATION,false,(Literal *)0x0,e);
            if (local_138 == (Clause **)0x0) {
              ::Lib::Stack<Kernel::Clause_*>::expand
                        ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
            }
            goto LAB_004bff8a;
          }
          if (PVar10 == NOT) goto switchD_004bf246_caseD_7;
        }
        uVar11 = 0;
        if (((PVar10 & ~OR) == PI) && (produceClauses::args._cursor != produceClauses::args._stack))
        {
          TVar15._content = arg2_00._content;
          if (bVar8) {
            TVar15._content = arg2._content;
          }
          TVar16 = Kernel::SortHelper::getResultSort(local_f0._content);
          TVar16._content =
               *(uint64_t *)
                (TVar16._content + 0x28 + (ulong)(*(uint *)(TVar16._content + 0xc) & 0xfffffff) * 8)
          ;
          if ((bool)((~bVar8 | PVar10 != PI) & (PVar10 != SIGMA || bVar8))) {
            if (index == (SkolemisingFormulaIndex *)0x0) {
LAB_004bfadc:
              term = (Term *)(produceClauses::args._stack)->_content;
              if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts == '\0') {
                produceClauses();
              }
              ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              reset((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                    &sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts);
              if (((ulong)term & 3) == 0) {
                Kernel::VariableWithSortIterator::VariableWithSortIterator
                          ((VariableWithSortIterator *)local_b8,term);
                while (bVar8 = Kernel::VariableWithSortIterator::hasNext
                                         ((VariableWithSortIterator *)local_b8), bVar8) {
                  local_48 = true;
                  pTVar3 = local_98[-1];
                  TVar17 = Kernel::SortHelper::getArgSort(local_78[-1],local_58[-1]);
                  ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                            *)&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                           (uint)(pTVar3->_content >> 2),TVar17);
                }
LAB_004bfc23:
                Kernel::VariableWithSortIterator::~VariableWithSortIterator
                          ((VariableWithSortIterator *)local_b8);
              }
              else {
                ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                       )&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                       (uint)((ulong)term >> 2),TVar16);
                if ((TVar16._content & 3) == 0) {
                  Kernel::VariableWithSortIterator::VariableWithSortIterator
                            ((VariableWithSortIterator *)local_b8,(Term *)TVar16._content);
                  while (bVar8 = Kernel::VariableWithSortIterator::hasNext
                                           ((VariableWithSortIterator *)local_b8), bVar8) {
                    local_48 = true;
                    pTVar3 = local_98[-1];
                    TVar17 = Kernel::SortHelper::getArgSort(local_78[-1],local_58[-1]);
                    ::Lib::
                    DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                    insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                            *)&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                           (uint)(pTVar3->_content >> 2),TVar17);
                  }
                  goto LAB_004bfc23;
                }
                TVar17 = Kernel::AtomicSort::superSort();
                ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                       )&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                       (uint)(TVar16._content >> 2),TVar17);
              }
              if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts == '\0') {
                produceClauses();
              }
              if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars == '\0') {
                produceClauses();
              }
              if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars == '\0') {
                produceClauses();
              }
              sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ =
                   sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._8_8_;
              sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._16_8_ =
                   sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._8_8_;
              sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._16_8_ =
                   sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._8_8_;
              local_e8._base._next = _DAT_00b7a9d8;
              local_e8._base._last = pERam0000000000b7a9e0;
              local_e8._base._timestamp = sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts;
              bVar8 = ::Lib::
                      DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                      Iterator::hasNext(&local_e8);
              while (bVar8 != false) {
                uVar11 = (local_e8._base._next)->_key;
                uVar4 = ((local_e8._base._next)->_val)._content;
                local_e8._base._next = local_e8._base._next + 1;
                TVar17 = Kernel::AtomicSort::superSort();
                if (uVar4 == TVar17._content) {
                  plVar19 = (long *)(sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars +
                                    0x10);
                  if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._16_8_ ==
                      sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._24_8_) {
                    ::Lib::Stack<Kernel::TermList>::expand
                              ((Stack<Kernel::TermList> *)
                               sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars);
                    plVar19 = (long *)(sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars +
                                      0x10);
                  }
                }
                else {
                  if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ ==
                      sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._24_8_) {
                    ::Lib::Stack<Kernel::TermList>::expand
                              ((Stack<Kernel::TermList> *)
                               sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts);
                  }
                  *(uint64_t *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_
                       = uVar4;
                  sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ =
                       sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ + 8;
                  plVar19 = (long *)(sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars +
                                    0x10);
                  if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._16_8_ ==
                      sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._24_8_) {
                    ::Lib::Stack<Kernel::TermList>::expand
                              ((Stack<Kernel::TermList> *)
                               sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars);
                    plVar19 = (long *)(sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars +
                                      0x10);
                  }
                }
                puVar5 = (ulong *)*plVar19;
                *puVar5 = (ulong)(uVar11 * 4 + 1);
                *plVar19 = (long)(puVar5 + 1);
                bVar8 = ::Lib::
                        DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                        Iterator::hasNext(&local_e8);
              }
              local_c0._content =
                   *(uint64_t *)
                    (TVar16._content + 0x28 +
                    (ulong)(*(uint *)(TVar16._content + 0xc) & 0xfffffff) * 8);
              Kernel::SortHelper::normaliseArgSorts
                        ((TermStack *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars,
                         (TermStack *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts)
              ;
              ::Lib::Stack<Kernel::TermList>::Stack
                        ((Stack<Kernel::TermList> *)local_b8,
                         (Stack<Kernel::TermList> *)
                         sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars);
              Kernel::SortHelper::normaliseSort((TermStack *)local_b8,&local_c0);
              if ((Stack<Kernel::Clause_*> *)local_b8._8_8_ != (Stack<Kernel::Clause_*> *)0x0) {
                uVar24 = local_b8._0_8_ * 8 + 0xfU & 0xfffffffffffffff0;
                if (uVar24 == 0) {
                  *(uint64_t *)local_b8._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_b8._8_8_;
                }
                else if (uVar24 < 0x11) {
                  *(uint64_t *)local_b8._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_b8._8_8_;
                }
                else if (uVar24 < 0x19) {
                  *(uint64_t *)local_b8._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_b8._8_8_;
                }
                else if (uVar24 < 0x21) {
                  *(uint64_t *)local_b8._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_b8._8_8_;
                }
                else if (uVar24 < 0x31) {
                  *(uint64_t *)local_b8._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_b8._8_8_;
                }
                else if (uVar24 < 0x41) {
                  *(uint64_t *)local_b8._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_b8._8_8_;
                }
                else {
                  operator_delete((void *)local_b8._8_8_,0x10);
                }
              }
              TVar17 = Kernel::AtomicSort::arrowSort
                                 ((TermStack *)
                                  sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts,
                                  local_c0);
              uVar11 = (uint)((ulong)(sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars.
                                      _16_8_ - sigmaRemoval(Kernel::TermList,Kernel::TermList)::
                                               typeVars._8_8_) >> 3);
              uVar11 = Shell::Skolem::addSkolemFunction
                                 (uVar11,uVar11,(TermList *)0x0,TVar17,(char *)0x0);
              TVar17._content =
                   (uint64_t)
                   Kernel::Term::create
                             (uVar11,(uint)((ulong)(sigmaRemoval(Kernel::TermList,Kernel::TermList)
                                                    ::typeVars._16_8_ -
                                                   sigmaRemoval(Kernel::TermList,Kernel::TermList)::
                                                   typeVars._8_8_) >> 3),
                              (TermList *)
                              sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._8_8_);
              sort_00 = Kernel::SortHelper::getResultSort((Term *)TVar17._content);
              TVar17 = ApplicativeHelper::createAppTerm
                                 (sort_00,TVar17,
                                  (TermStack *)
                                  sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars);
              if (index != (SkolemisingFormulaIndex *)0x0) {
                Kernel::SortHelper::getResultSort((Term *)TVar18._content);
                Indexing::SkolemisingFormulaIndex::insertFormula(index,TVar18,TVar17);
              }
              TVar17 = ApplicativeHelper::createAppTerm
                                 (TVar16,(produceClauses::args._stack)->_content,TVar17);
            }
            else {
              TVar17 = Kernel::SortHelper::getResultSort(TVar18._content);
              pTVar2 = (index->super_TermIndex<Indexing::TermWithValue<Kernel::TermList>_>)._is._M_t
                       .
                       super___uniq_ptr_impl<Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>,_std::default_delete<Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_*,_std::default_delete<Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_>_>
                       .
                       super__Head_base<0UL,_Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_*,_false>
                       ._M_head_impl;
              (*pTVar2->_vptr_TermIndexingStructure[6])
                        (&local_e8,pTVar2,TVar18._content,TVar17._content);
              cVar9 = (**(code **)(*(long *)local_e8._base._next + 0x10))();
              if (cVar9 == '\0') {
                if (local_e8._base._next != (Entry *)0x0) {
                  pTVar3 = &(local_e8._base._next)->_val;
                  *(int *)&pTVar3->_content = (int)pTVar3->_content + -1;
                  if ((int)pTVar3->_content == 0) {
                    (**(code **)(*(long *)local_e8._base._next + 8))();
                  }
                }
                goto LAB_004bfadc;
              }
              (**(code **)(*(long *)local_e8._base._next + 0x18))(local_b8);
              TVar17._content =
                   (**(code **)&(*(Clause **)local_b8._0_8_)[1].super_Unit)
                             (local_b8._0_8_,local_a8[2]._content);
              TVar17 = ApplicativeHelper::createAppTerm
                                 (TVar16,(produceClauses::args._stack)->_content,TVar17);
              if (((((Clause **)local_b8._0_8_ != (Clause **)0x0) &&
                   ((Stack<Kernel::Clause_*> *)local_b8._8_8_ != (Stack<Kernel::Clause_*> *)0x0)) &&
                  (*(int *)(uint64_t *)local_b8._8_8_ = (int)*(uint64_t *)local_b8._8_8_ + -1,
                  (int)*(uint64_t *)local_b8._8_8_ == 0)) &&
                 ((**(code **)&((*(Clause **)local_b8._0_8_)->super_Unit)._inference)(),
                 (Stack<Kernel::Clause_*> *)local_b8._8_8_ != (Stack<Kernel::Clause_*> *)0x0)) {
                *(uint64_t *)local_b8._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_b8._8_8_;
              }
              if (local_e8._base._next != (Entry *)0x0) {
                pTVar3 = &(local_e8._base._next)->_val;
                *(int *)&pTVar3->_content = (int)pTVar3->_content + -1;
                if ((int)pTVar3->_content == 0) {
                  (**(code **)(*(long *)local_e8._base._next + 8))();
                }
              }
              if (cVar9 == '\0') goto LAB_004bfadc;
            }
            r = VSIGMA_ELIMINATION;
          }
          else {
            TVar17 = (TermList)(produceClauses::args._stack)->_content;
            uVar11 = Kernel::Clause::maxVar(c);
            uVar11 = uVar11 * 4 + 5;
            do {
              TVar18._content._4_4_ = 0;
              TVar18._content._0_4_ = uVar11;
              TVar17 = ApplicativeHelper::createAppTerm(TVar16,TVar17,TVar18);
              TVar16._content =
                   *(uint64_t *)
                    (TVar16._content + 0x20 +
                    (ulong)(*(uint *)(TVar16._content + 0xc) & 0xfffffff) * 8);
              TVar18 = Kernel::AtomicSort::boolSort();
              uVar11 = uVar11 + 4;
            } while (TVar16._content != TVar18._content);
            r = VPI_ELIMINATION;
          }
          pLVar20 = Kernel::Literal::createEquality(true,TVar17,TVar15,sort);
          pCVar21 = replaceLits(c,lit,pLVar20,r,false,(Literal *)0x0,e);
          if (local_138 == (Clause **)0x0) {
            ::Lib::Stack<Kernel::Clause_*>::expand
                      ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8);
          }
LAB_004bff8a:
          *local_138 = pCVar21;
          local_138 = local_138 + 1;
          uVar11 = 5;
        }
LAB_004bff9d:
        if ((uVar11 & 3) != 0) goto LAB_004bffec;
        uVar24 = local_38 + 1;
      } while (uVar24 != local_40);
    }
    uVar11 = 2;
LAB_004bffec:
    pIVar6 = local_c8;
    if (uVar11 != 5) {
      if (uVar11 != 2) {
        return (ClauseIterator)local_c8;
      }
      ::Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
      return (ClauseIterator)pIVar6;
    }
    local_b8._0_8_ = local_138;
    if (local_138 == (Clause **)0x0) {
      local_b8._8_8_ = (Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8;
      ::Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
    }
    else {
      local_b8._8_8_ = (Stack<Kernel::Clause_*> *)&stack0xfffffffffffffeb8;
      local_f8 = (_func_int *)::operator_new(0x20);
      *(undefined4 *)(local_f8 + 8) = 0;
      *(undefined ***)local_f8 = &PTR__UniquePersistentIterator_00b63628;
      pIVar22 = ::Lib::UniquePersistentIterator<Lib::Stack<Kernel::Clause_*>::Iterator>::
                getUniqueItemList((Iterator *)local_b8,(size_t *)(local_f8 + 0x18));
      *(ItemList **)(local_f8 + 0x10) = pIVar22;
      *(int *)(local_f8 + 8) = *(int *)(local_f8 + 8) + 1;
    }
    pp_Var23 = (_func_int **)
               ::Lib::FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30))
    ;
    if (local_f8 != (_func_int *)0x0) {
      *(int *)(local_f8 + 8) = *(int *)(local_f8 + 8) + 1;
    }
    *(undefined4 *)(pp_Var23 + 1) = 0;
    *pp_Var23 = (_func_int *)&PTR__ProxyIterator_00b635d0;
    pp_Var23[2] = local_f8;
    if (local_f8 == (_func_int *)0x0) {
      pIVar6->_vptr_IteratorCore = pp_Var23;
      *(undefined4 *)(pp_Var23 + 1) = 1;
    }
    else {
      *(int *)(local_f8 + 8) = *(int *)(local_f8 + 8) + 1;
      pIVar6->_vptr_IteratorCore = pp_Var23;
      *(int *)(pp_Var23 + 1) = *(int *)(pp_Var23 + 1) + 1;
      pcVar1 = local_f8 + 8;
      *(int *)pcVar1 = *(int *)pcVar1 + -1;
      if (*(int *)pcVar1 == 0) {
        (**(code **)(*(long *)local_f8 + 8))();
      }
    }
    if (local_f8 == (_func_int *)0x0) {
      return (ClauseIterator)pIVar6;
    }
    pcVar1 = local_f8 + 8;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 != 0) {
      return (ClauseIterator)pIVar6;
    }
    (**(code **)(*(long *)local_f8 + 8))();
    return (ClauseIterator)pIVar6;
  }
LAB_004bf0e2:
  ::Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator produceClauses(Clause* c, bool generating, SkolemisingFormulaIndex* index)
{
  static bool eager = env.options->cnfOnTheFly() == Options::CNFOnTheFly::EAGER;
  static bool simp = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP;
  static bool gen = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_GEN;
  static bool simp_except_not_be_off = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP_NOT_GEN_BOOL_EQ_OFF;
  static bool simp_except_not_and_be = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP_NOT_GEN_BOOL_EQ_GEN;
  bool not_be = simp_except_not_be_off || (!generating && simp_except_not_and_be);


  if(generating && (eager || simp)){ return ClauseIterator::getEmpty(); }
  if(!generating && gen){ return ClauseIterator::getEmpty(); }

  TermList troo = TermList(Term::foolTrue());
  TermList fols = TermList(Term::foolFalse());
  TermList boolSort = AtomicSort::boolSort();

  static TermStack args;
  TermList head;
 
  ClauseStack resultStack;
  unsigned clength = c->length();

  for(unsigned i = 0; i < clength; i++){
    Literal* lit = (*c)[i];
    TermList lhs = *lit->nthArgument(0);
    TermList rhs = *lit->nthArgument(1);
    TermList term;
    TermList boolVal;
    if(AH::isBool(lhs)){
      boolVal = lhs;
      term = rhs;
    } else if(AH::isBool(rhs)){
      boolVal = rhs;
      term = lhs;
    } else if(SortHelper::getEqualityArgumentSort(lit) == boolSort && !not_be) {
      //equality or diseqality between boolean terms
      Literal* lhsTroo = Literal::createEquality(true, lhs, troo, boolSort);
      Literal* lhsFols = Literal::createEquality(true, lhs, fols, boolSort);
      Literal* rhsTroo = Literal::createEquality(true, rhs, troo, boolSort);
      Literal* rhsFols = Literal::createEquality(true, rhs, fols, boolSort);
      if(lit->polarity()){
        Clause* res1 = replaceLits(c, lit, lhsTroo, convert(Signature::IFF), true, rhsFols);
        Clause* res2 = replaceLits(c, lit, lhsFols, convert(Signature::IFF), true, rhsTroo);
        resultStack.push(res1);
        resultStack.push(res2);
      } else {
        Clause* res1 = replaceLits(c, lit, lhsTroo, convert(Signature::XOR), true, rhsTroo);
        Clause* res2 = replaceLits(c, lit, lhsFols, convert(Signature::XOR), true, rhsFols);
        resultStack.push(res1);
        resultStack.push(res2);
      }
      goto afterLoop;
    } else {
      continue;
    }

    AH::getHeadAndArgs(term, head, args);
    Signature::Proxy prox = AH::getProxy(head);
    if(prox == Signature::NOT_PROXY || prox == Signature::IFF ||
       prox == Signature::XOR){
      continue;
    }

    if(generating && !gen && prox != Signature::NOT){
      continue;
    }

    bool positive = AH::isTrue(boolVal) == lit->polarity();

    if((prox == Signature::OR) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[0], troo, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      } else {
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], fols, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      }
    }
  
    if((prox == Signature::AND) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[0], troo, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      } else {
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], fols, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      }
    }

    if((prox == Signature::IMP) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[1], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[0], troo, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      } else {
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);        
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      }
    }

    if((prox == Signature::EQUALS) && (args.size() == 2)){
      TermList srt = *SortHelper::getResultSort(head.term()).term()->nthArgument(0);
      Literal* l1 = Literal::createEquality(positive, args[0], args[1], srt);
      Clause* res = replaceLits(c, lit, l1, convert(prox), false);
      resultStack.push(res);
      goto afterLoop;
    }

    if((prox == Signature::NOT) && (args.size())){
      TermList rhs = positive ? fols : troo;
      Literal* l1 = Literal::createEquality(true, args[0], rhs, boolSort);
      Clause* res = replaceLits(c, lit, l1, convert(prox), false);
      resultStack.push(res);
      goto afterLoop;
    }

    if((prox == Signature::PI || prox == Signature::SIGMA ) && (args.size())){
      TermList rhs = positive ? troo : fols; 
      TermList srt = *SortHelper::getResultSort(head.term()).term()->nthArgument(0);
      TermList newTerm;
      InferenceRule rule;
      if((prox == Signature::PI && positive) || 
         (prox == Signature::SIGMA && !positive)){
        rule = convert(Signature::PI);
        newTerm = piRemoval(args[0], c, srt);
      } else {
        ASS(term.isTerm());
        bool newTermCreated = false;
        if(index){
          auto results = index->getGeneralizations(TypedTermList(term.term()), true);
          if(results.hasNext()){
            auto tqr = results.next();
            TermList skolemTerm = tqr.data->value;
            skolemTerm = tqr.unifier->applyToBoundResult(skolemTerm);
            newTerm = AH::createAppTerm(srt, args[0], skolemTerm);
            newTermCreated = true;
          }
        }
        if(!newTermCreated){
          TermList skolemTerm = sigmaRemoval(args[0], srt);
          if(index){
            index->insertFormula(TypedTermList(term.term()), skolemTerm);
          }
          newTerm = AH::createAppTerm(srt, args[0], skolemTerm);
        }
        rule = convert(Signature::SIGMA);
      }
      Literal* l1 = Literal::createEquality(true, newTerm, rhs, boolSort);
      Clause* res = replaceLits(c, lit, l1, rule, false);
      resultStack.push(res);
      goto afterLoop;
    }

  }
  
  return ClauseIterator::getEmpty(); 

afterLoop:  

  return pvi(getUniquePersistentIterator(ClauseStack::Iterator(resultStack)));

}